

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

string * __thiscall
cmCryptoHash::ByteHashToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCryptoHash *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *hash)

{
  rhash_context *prVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  prVar1 = *(rhash_context **)this;
  if (prVar1 != this->CTX) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      prVar1 = (rhash_context *)((long)&prVar1->msg_size + 1);
    } while (prVar1 != this->CTX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::ByteHashToString(
  const std::vector<unsigned char>& hash)
{
  // Map from 4-bit index to hexadecimal representation.
  static char const hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7',
                                '8', '9', 'a', 'b', 'c', 'd', 'e', 'f' };

  std::string res;
  for (std::vector<unsigned char>::const_iterator vit = hash.begin();
       vit != hash.end(); ++vit) {
    res.push_back(hex[(*vit) >> 4]);
    res.push_back(hex[(*vit) & 0xF]);
  }
  return res;
}